

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_debug.h
# Opt level: O0

bool immutable::rrb_details::validate_subtree<char,false,5>
               (ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t expected_size,
               uint32_t root_shift)

{
  uint uVar1;
  uint32_t *puVar2;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar3;
  uint uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t expected_size_00;
  tree_node<char,_false> *ptVar7;
  leaf_node<char,_false> *plVar8;
  uint *puVar9;
  internal_node<char,_false> *piVar10;
  rrb_size_table<false> *prVar11;
  uint32_t local_ac;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_70;
  ref<immutable::rrb_details::tree_node<char,_false>_> child_1;
  ref<immutable::rrb_details::tree_node<char,_false>_> child_2;
  uint32_t i_1;
  uint32_t child_max_size;
  uint32_t child_shift;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  uint32_t size_sub_trie;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<char,_false>_> internal;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_28;
  ref<immutable::rrb_details::leaf_node<char,_false>_> leaf;
  uint32_t root_shift_local;
  uint32_t expected_size_local;
  ref<immutable::rrb_details::tree_node<char,_false>_> *root_local;
  
  leaf.ptr._0_4_ = root_shift;
  leaf.ptr._4_4_ = expected_size;
  if (root_shift == 0) {
    ptVar7 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->(root);
    if (ptVar7->type != LEAF_NODE) {
      printf("Expected this node to be a leaf node, but it claims to be something else.\n");
      printf("Will treat it like a leaf node, so may segfault.\n");
      root_local._7_1_ = 0;
      goto LAB_0017c858;
    }
    ref<immutable::rrb_details::leaf_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::leaf_node<char,false>> *)&local_28,root);
    plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_28);
    internal.ptr._0_1_ = plVar8->len != leaf.ptr._4_4_;
    if (internal.ptr._0_1_) {
      plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_28);
      uVar4 = leaf.ptr._4_4_;
      uVar1 = plVar8->len;
      plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_28);
      puVar9 = std::max<unsigned_int>(&plVar8->len,(uint *)((long)&leaf.ptr + 4));
      printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n"
             ,(ulong)uVar1,(ulong)uVar4,(ulong)*puVar9);
      root_local._7_1_ = 0;
    }
    internal.ptr._1_3_ = 0;
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_28);
  }
  else {
    ptVar7 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->(root);
    if (ptVar7->type != INTERNAL_NODE) {
      printf("Expected this node to be an internal node, but it claims to be something else.\n");
      printf("Will treat it like an internal node, so may segfault.\n");
      root_local._7_1_ = 0;
      goto LAB_0017c858;
    }
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&size_sub_trie,root);
    piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                        ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&size_sub_trie)
    ;
    uVar1 = leaf.ptr._4_4_;
    if ((piVar10->size_table).ptr == (rrb_size_table<false> *)0x0) {
      uVar6 = (uint32_t)leaf.ptr - 5;
      expected_size_00 = 1 << ((byte)(uint32_t)leaf.ptr & 0x1f);
      piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                          ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                           &size_sub_trie);
      uVar4 = leaf.ptr._4_4_;
      if (piVar10->len * expected_size_00 < uVar1) {
        piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                             &size_sub_trie);
        printf("Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n",
               (ulong)uVar4,(ulong)(piVar10->len * expected_size_00));
        root_local._7_1_ = 0;
        internal.ptr._0_4_ = 1;
      }
      else {
        piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                             &size_sub_trie);
        uVar1 = leaf.ptr._4_4_;
        if (uVar4 < (piVar10->len - 1) * expected_size_00) {
          piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                               &size_sub_trie);
          printf("Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n"
                 ,(ulong)uVar1,(ulong)(piVar10->len - 1 << ((byte)leaf.ptr & 0x1f)));
          root_local._7_1_ = 0;
          internal.ptr._0_4_ = 1;
        }
        else {
          for (child_2.ptr._4_4_ = 0;
              piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                   &size_sub_trie), child_2.ptr._4_4_ < piVar10->len - 1;
              child_2.ptr._4_4_ = child_2.ptr._4_4_ + 1) {
            piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                 &size_sub_trie);
            ref<immutable::rrb_details::tree_node<char,false>>::
            ref<immutable::rrb_details::internal_node<char,false>>
                      ((ref<immutable::rrb_details::tree_node<char,false>> *)&child_1,
                       piVar10->child + child_2.ptr._4_4_);
            bVar5 = validate_subtree<char,false,5>(&child_1,expected_size_00,uVar6);
            if (!bVar5) {
              root_local._7_1_ = 0;
            }
            internal.ptr._1_3_ = 0;
            internal.ptr._0_1_ = !bVar5;
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&child_1);
            if ((uint)internal.ptr != 0) goto LAB_0017c833;
          }
          piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                               &size_sub_trie);
          prVar3 = piVar10->child;
          piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                               &size_sub_trie);
          ref<immutable::rrb_details::tree_node<char,false>>::
          ref<immutable::rrb_details::internal_node<char,false>>
                    ((ref<immutable::rrb_details::tree_node<char,false>> *)&local_70,
                     prVar3 + (piVar10->len - 1));
          uVar1 = leaf.ptr._4_4_;
          piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                               &size_sub_trie);
          bVar5 = validate_subtree<char,false,5>
                            (&local_70,uVar1 - (piVar10->len - 1) * expected_size_00,uVar6);
          if (!bVar5) {
            root_local._7_1_ = 0;
          }
          internal.ptr._1_3_ = 0;
          internal.ptr._0_1_ = !bVar5;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_70);
          if ((uint)internal.ptr == 0) goto LAB_0017c82c;
        }
      }
    }
    else {
      piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                          ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                           &size_sub_trie);
      prVar11 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                          (&piVar10->size_table);
      puVar2 = prVar11->size;
      piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                          ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                           &size_sub_trie);
      uVar1 = leaf.ptr._4_4_;
      if (puVar2[piVar10->len - 1] == leaf.ptr._4_4_) {
        for (child.ptr._4_4_ = 0; uVar1 = child.ptr._4_4_,
            piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                 &size_sub_trie), uVar1 < piVar10->len;
            child.ptr._4_4_ = child.ptr._4_4_ + 1) {
          piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                               &size_sub_trie);
          prVar11 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                              (&piVar10->size_table);
          uVar6 = prVar11->size[child.ptr._4_4_];
          if (child.ptr._4_4_ == 0) {
            local_ac = 0;
          }
          else {
            piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                 &size_sub_trie);
            prVar11 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                                (&piVar10->size_table);
            local_ac = prVar11->size[child.ptr._4_4_ - 1];
          }
          child.ptr._0_4_ = uVar6 - local_ac;
          piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                               &size_sub_trie);
          ref<immutable::rrb_details::tree_node<char,false>>::
          ref<immutable::rrb_details::internal_node<char,false>>
                    ((ref<immutable::rrb_details::tree_node<char,false>> *)&child_max_size,
                     piVar10->child + child.ptr._4_4_);
          bVar5 = validate_subtree<char,false,5>
                            ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&child_max_size
                             ,(uint32_t)child.ptr,(uint32_t)leaf.ptr - 5);
          if (!bVar5) {
            root_local._7_1_ = 0;
          }
          internal.ptr._1_3_ = 0;
          internal.ptr._0_1_ = !bVar5;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&child_max_size);
          if ((uint)internal.ptr != 0) goto LAB_0017c833;
        }
LAB_0017c82c:
        internal.ptr._0_4_ = 0;
      }
      else {
        piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                             &size_sub_trie);
        prVar11 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                            (&piVar10->size_table);
        puVar2 = prVar11->size;
        piVar10 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                             &size_sub_trie);
        printf("Expected subtree to be of size %u, but its size table says it is %u.\n",(ulong)uVar1
               ,(ulong)puVar2[piVar10->len - 1]);
        root_local._7_1_ = 0;
        internal.ptr._0_4_ = 1;
      }
    }
LAB_0017c833:
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&size_sub_trie);
  }
  if ((uint)internal.ptr == 0) {
    root_local._7_1_ = 1;
  }
LAB_0017c858:
  return (bool)(root_local._7_1_ & 1);
}

Assistant:

bool validate_subtree(const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t expected_size, uint32_t root_shift)
      {
      if (root_shift == 0)
        { // leaf node
        if (root->type != LEAF_NODE)
          {
          printf("Expected this node to be a leaf node, but it claims to be something else.\n");
          printf("Will treat it like a leaf node, so may segfault.\n");
          return false;
          }
        ref<leaf_node<T, atomic_ref_counting>> leaf = root;
        if (leaf->len != expected_size)
          {
          printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n",
            leaf->len, expected_size, std::max<uint32_t>(leaf->len, expected_size));
          return false;
          }
        }
      else
        {
        if (root->type != INTERNAL_NODE)
          {
          printf("Expected this node to be an internal node, but it claims to be something else.\n");
          printf("Will treat it like an internal node, so may segfault.\n");
          return false;
          }
        ref<internal_node<T, atomic_ref_counting>> internal = root;
        if (internal->size_table.ptr != nullptr)
          {
          // expected size should be consistent with what's in the last size table
          // slot
          if (internal->size_table->size[internal->len - 1] != expected_size)
            {
            printf("Expected subtree to be of size %u, but its size table says it is %u.\n", expected_size,
              internal->size_table->size[internal->len - 1]);
            return false;
            }
          for (uint32_t i = 0; i < internal->len; i++)
            {
            uint32_t size_sub_trie = internal->size_table->size[i] - (i == 0 ? 0 : internal->size_table->size[i - 1]);
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, size_sub_trie, root_shift - bits<N>::rrb_bits))
              return false;
            }
          }
        else
          {
          // internal->size_table == NULL
          // this tree may contain at most (internal->len << shift) elements, not
          // more. Effectively, the tree contains (len - 1) << shift + last_tree_len
          // (1 << shift) >= last_tree_len > 0
          const uint32_t child_shift = root_shift - bits<N>::rrb_bits;
          const uint32_t child_max_size = 1 << root_shift;

          if (expected_size > internal->len * child_max_size)
            {
            printf("Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n", expected_size,
              internal->len * child_max_size);
            return false;
            }
          else if (expected_size < ((internal->len - 1) * child_max_size))
            {
            printf("Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n",
              expected_size, ((internal->len - 1) << root_shift));
            return false;
            }
          for (uint32_t i = 0; i < internal->len - 1; i++)
            {
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, child_max_size, child_shift))
              return false;
            }
          ref<tree_node<T, atomic_ref_counting>> child = internal->child[internal->len - 1];
          if (!validate_subtree<T, atomic_ref_counting, N>(child, expected_size - ((internal->len - 1) * child_max_size), child_shift))
            return false;
          }
        }
      return true;
      }